

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

void BZ2_bzReadClose(int *bzerror,BZFILE *b)

{
  bz_stream *in_RSI;
  undefined4 *in_RDI;
  bzFile *bzf;
  
  if (in_RDI != (undefined4 *)0x0) {
    *in_RDI = 0;
  }
  if (in_RSI == (bz_stream *)0x0) {
    if (in_RDI != (undefined4 *)0x0) {
      *in_RDI = 0;
    }
  }
  else {
    *(undefined4 *)&in_RSI[0x3f].bzalloc = 0;
    if (*(char *)((long)&in_RSI[0x3e].state + 4) == '\0') {
      if (*(char *)((long)&in_RSI[0x3f].bzalloc + 4) != '\0') {
        BZ2_bzDecompressEnd(in_RSI);
      }
      free(in_RSI);
    }
    else {
      if (in_RDI != (undefined4 *)0x0) {
        *in_RDI = 0xffffffff;
      }
      if (in_RSI != (bz_stream *)0x0) {
        *(undefined4 *)&in_RSI[0x3f].bzalloc = 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void BZ_API(BZ2_bzReadClose) ( int *bzerror, BZFILE *b )
{
   bzFile* bzf = (bzFile*)b;

   BZ_SETERR(BZ_OK);
   if (bzf == NULL)
      { BZ_SETERR(BZ_OK); return; };

   if (bzf->writing)
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return; };

   if (bzf->initialisedOk)
      (void)BZ2_bzDecompressEnd ( &(bzf->strm) );
   free ( bzf );
}